

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_state.hpp
# Opt level: O3

idx_t duckdb::QuantileOperation::FrameSize<duckdb::hugeint_t>
                (QuantileIncluded<duckdb::hugeint_t> *included,SubFrames *frames)

{
  pointer pFVar1;
  unsigned_long *puVar2;
  CURSOR_TYPE *pCVar3;
  FrameBounds *frame;
  pointer pFVar4;
  reference pvVar5;
  ColumnDataScanState *pCVar6;
  ulong uVar7;
  idx_t iVar8;
  FrameBounds *frame_1;
  ColumnDataScanState *pCVar9;
  
  if (((included->fmask->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
       (unsigned_long *)0x0) && (included->dmask->all_valid == true)) {
    pFVar4 = (frames->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>).
             super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>._M_impl.
             super__Vector_impl_data._M_start;
    pFVar1 = (frames->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>).
             super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pFVar4 != pFVar1) {
      iVar8 = 0;
      do {
        iVar8 = (iVar8 + pFVar4->end) - pFVar4->start;
        pFVar4 = pFVar4 + 1;
      } while (pFVar4 != pFVar1);
      return iVar8;
    }
  }
  else {
    pFVar4 = (frames->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>).
             super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>._M_impl.
             super__Vector_impl_data._M_start;
    pFVar1 = (frames->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>).
             super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pFVar4 != pFVar1) {
      iVar8 = 0;
      do {
        for (pCVar9 = (ColumnDataScanState *)pFVar4->start;
            pCVar9 < (ColumnDataScanState *)pFVar4->end;
            pCVar9 = (ColumnDataScanState *)
                     ((long)&(pCVar9->current_chunk_state).handles._M_h._M_buckets + 1)) {
          puVar2 = (included->fmask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
          if ((puVar2 == (unsigned_long *)0x0) ||
             ((puVar2[(ulong)pCVar9 >> 6] >> ((ulong)pCVar9 & 0x3f) & 1) != 0)) {
            pCVar3 = included->dmask;
            pCVar6 = (ColumnDataScanState *)(pCVar3->scan).current_row_index;
            if (pCVar9 < pCVar6 || (ColumnDataScanState *)(pCVar3->scan).next_row_index <= pCVar9) {
              duckdb::ColumnDataCollection::Seek
                        ((ulong)pCVar3->inputs,pCVar9,(DataChunk *)&pCVar3->scan);
              pvVar5 = vector<duckdb::Vector,_true>::operator[]
                                 ((vector<duckdb::Vector,_true> *)&pCVar3->page,0);
              pCVar3->data = *(hugeint_t **)(pvVar5 + 0x20);
              pvVar5 = vector<duckdb::Vector,_true>::operator[]
                                 ((vector<duckdb::Vector,_true> *)&pCVar3->page,0);
              FlatVector::VerifyFlatVector(pvVar5);
              pvVar5 = pvVar5 + 0x28;
              pCVar3->validity = (ValidityMask *)pvVar5;
              pCVar6 = (ColumnDataScanState *)(pCVar3->scan).current_row_index;
            }
            else {
              pvVar5 = (reference)pCVar3->validity;
            }
            if (*(long *)pvVar5 == 0) {
              uVar7 = 1;
            }
            else {
              uVar7 = (ulong)((*(ulong *)(*(long *)pvVar5 +
                                         ((ulong)((long)pCVar9 - (long)pCVar6) >> 6 & 0x3ffffff) * 8
                                         ) >> ((long)pCVar9 - (long)pCVar6 & 0x3fU) & 1) != 0);
            }
          }
          else {
            uVar7 = 0;
          }
          iVar8 = iVar8 + uVar7;
        }
        pFVar4 = pFVar4 + 1;
      } while (pFVar4 != pFVar1);
      return iVar8;
    }
  }
  return 0;
}

Assistant:

static idx_t FrameSize(QuantileIncluded<INPUT_TYPE> &included, const SubFrames &frames) {
		//	Count the number of valid values
		idx_t n = 0;
		if (included.AllValid()) {
			for (const auto &frame : frames) {
				n += frame.end - frame.start;
			}
		} else {
			//	NULLs or FILTERed values,
			for (const auto &frame : frames) {
				for (auto i = frame.start; i < frame.end; ++i) {
					n += included(i);
				}
			}
		}

		return n;
	}